

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

int vorbis_finish_frame(stb_vorbis *f,int len,int left,int right)

{
  int iVar1;
  float *pfVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  vorb *in_RDI;
  float *w;
  int n;
  int j_1;
  int i_1;
  int j;
  int i;
  int prev;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_1c;
  int local_4;
  
  if (in_RDI->previous_length != 0) {
    iVar1 = in_RDI->previous_length;
    pfVar2 = get_window(in_RDI,iVar1);
    if (pfVar2 == (float *)0x0) {
      return 0;
    }
    for (local_2c = 0; local_2c < in_RDI->channels; local_2c = local_2c + 1) {
      for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
        in_RDI->channel_buffers[local_2c][in_EDX + local_30] =
             in_RDI->channel_buffers[local_2c][in_EDX + local_30] * pfVar2[local_30] +
             in_RDI->previous_window[local_2c][local_30] * pfVar2[(iVar1 + -1) - local_30];
      }
    }
  }
  iVar1 = in_RDI->previous_length;
  in_RDI->previous_length = in_ESI - in_ECX;
  for (local_24 = 0; local_24 < in_RDI->channels; local_24 = local_24 + 1) {
    for (local_28 = 0; in_ECX + local_28 < in_ESI; local_28 = local_28 + 1) {
      in_RDI->previous_window[local_24][local_28] =
           in_RDI->channel_buffers[local_24][in_ECX + local_28];
    }
  }
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    local_1c = in_ECX;
    if (in_ESI < in_ECX) {
      local_1c = in_ESI;
    }
    in_RDI->samples_output = (local_1c - in_EDX) + in_RDI->samples_output;
    local_4 = local_1c - in_EDX;
  }
  return local_4;
}

Assistant:

static int vorbis_finish_frame(stb_vorbis *f, int len, int left, int right)
{
   int prev,i,j;
   // we use right&left (the start of the right- and left-window sin()-regions)
   // to determine how much to return, rather than inferring from the rules
   // (same result, clearer code); 'left' indicates where our sin() window
   // starts, therefore where the previous window's right edge starts, and
   // therefore where to start mixing from the previous buffer. 'right'
   // indicates where our sin() ending-window starts, therefore that's where
   // we start saving, and where our returned-data ends.

   // mixin from previous window
   if (f->previous_length) {
      int i,j, n = f->previous_length;
      float *w = get_window(f, n);
      if (w == NULL) return 0;
      for (i=0; i < f->channels; ++i) {
         for (j=0; j < n; ++j)
            f->channel_buffers[i][left+j] =
               f->channel_buffers[i][left+j]*w[    j] +
               f->previous_window[i][     j]*w[n-1-j];
      }
   }

   prev = f->previous_length;

   // last half of this data becomes previous window
   f->previous_length = len - right;

   // @OPTIMIZE: could avoid this copy by double-buffering the
   // output (flipping previous_window with channel_buffers), but
   // then previous_window would have to be 2x as large, and
   // channel_buffers couldn't be temp mem (although they're NOT
   // currently temp mem, they could be (unless we want to level
   // performance by spreading out the computation))
   for (i=0; i < f->channels; ++i)
      for (j=0; right+j < len; ++j)
         f->previous_window[i][j] = f->channel_buffers[i][right+j];

   if (!prev)
      // there was no previous packet, so this data isn't valid...
      // this isn't entirely true, only the would-have-overlapped data
      // isn't valid, but this seems to be what the spec requires
      return 0;

   // truncate a short frame
   if (len < right) right = len;

   f->samples_output += right-left;

   return right - left;
}